

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::CLUFactor<double>::initFactorMatrix
          (CLUFactor<double> *this,SVectorBase<double> **vec,double eps)

{
  U *pUVar1;
  Col *pCVar2;
  Dring *pDVar3;
  int *piVar4;
  int iVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  SVectorBase<double> *pSVar9;
  int *piVar10;
  pointer pdVar11;
  int *piVar12;
  Dring *pDVar13;
  Nonzero<double> *pNVar14;
  int iVar15;
  Nonzero<double> *pNVar16;
  int iVar17;
  Dring *pDVar18;
  uint uVar19;
  ulong uVar20;
  int *piVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  Dring *pDVar25;
  long lVar26;
  Dring *pDVar27;
  long lVar28;
  long lVar29;
  Dring *pDVar30;
  double dVar31;
  double dVar32;
  
  piVar6 = (this->temp).s_mark;
  dVar32 = 0.0;
  if (0 < this->thedim) {
    piVar7 = (this->u).row.len;
    piVar8 = (this->u).row.max;
    lVar23 = 0;
    do {
      piVar7[lVar23] = 0;
      piVar8[lVar23] = 0;
      lVar23 = lVar23 + 1;
      uVar20 = (ulong)this->thedim;
    } while (lVar23 < (long)uVar20);
    if (0 < this->thedim) {
      piVar7 = (this->u).row.max;
      lVar23 = 0;
      iVar22 = 0;
      do {
        iVar17 = vec[lVar23]->memused;
        if ((long)iVar17 < 2) {
          if (iVar17 == 0) goto LAB_001dbbd9;
        }
        else {
          pNVar16 = vec[lVar23]->m_elem;
          lVar26 = 0;
          do {
            piVar8 = piVar7 + *(int *)((long)&pNVar16->idx + lVar26);
            *piVar8 = *piVar8 + 1;
            lVar26 = lVar26 + 0x10;
          } while ((long)iVar17 << 4 != lVar26);
          iVar22 = iVar17 + iVar22;
          uVar20 = (ulong)(uint)this->thedim;
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 < (int)uVar20);
      dVar32 = (double)iVar22;
    }
  }
  minRowMem(this,(int)(this->rowMemMult * dVar32));
  iVar22 = (int)(this->colMemMult * dVar32);
  if ((this->u).col.size < iVar22) {
    (this->u).col.size = iVar22;
    spx_realloc<int*>(&(this->u).col.idx,iVar22);
  }
  minLMem(this,(int)(dVar32 * this->lMemMult));
  pUVar1 = &this->u;
  piVar7 = (this->u).row.start;
  *piVar7 = 0;
  pDVar25 = (this->u).row.elem;
  piVar8 = (this->u).row.max;
  iVar22 = this->thedim;
  lVar23 = (long)iVar22;
  pCVar2 = &(this->u).col;
  (this->u).row.list.idx = iVar22;
  (this->u).row.list.next = pDVar25;
  pDVar27 = (this->u).col.elem;
  (this->u).col.list.idx = iVar22;
  (this->u).col.list.next = pDVar27;
  if (lVar23 < 1) {
    iVar22 = 0;
    pDVar25 = (Dring *)pUVar1;
    pDVar27 = &pCVar2->list;
  }
  else {
    lVar29 = 0;
    iVar22 = 0;
    pDVar13 = (Dring *)pUVar1;
    pDVar18 = &pCVar2->list;
    lVar26 = 0;
    pDVar30 = pDVar27;
    do {
      lVar28 = lVar26;
      pDVar3 = (Dring *)((long)&pDVar25->next + lVar28);
      piVar7[lVar29] = iVar22;
      iVar22 = iVar22 + piVar8[lVar29];
      *(int *)((long)&pDVar25->idx + lVar28) = (int)lVar29;
      *(Dring **)((long)&pDVar25->prev + lVar28) = pDVar13;
      (((Row *)&pDVar13->next)->list).next = pDVar3;
      *(int *)((long)&pDVar27->idx + lVar28) = (int)lVar29;
      *(Dring **)((long)&pDVar27->prev + lVar28) = pDVar18;
      ((Dring *)&pDVar18->next)->next = (Dring *)((long)&((Dring *)&pDVar27->next)->next + lVar28);
      lVar29 = lVar29 + 1;
      lVar23 = (long)this->thedim;
      pDVar13 = pDVar3;
      pDVar18 = pDVar30;
      lVar26 = lVar28 + 0x18;
      pDVar30 = pDVar30 + 1;
    } while (lVar29 < lVar23);
    pDVar25 = (Dring *)((long)&pDVar25->next + lVar28);
    pDVar27 = (Dring *)((long)&((Dring *)&pDVar27->next)->next + lVar28);
  }
  iVar17 = 0;
  piVar7[lVar23] = 0;
  piVar8[this->thedim] = 0;
  (this->u).row.used = iVar22;
  (((Row *)&pDVar25->next)->list).next = (Dring *)pUVar1;
  (this->u).row.list.prev = pDVar25;
  ((Dring *)&pDVar27->next)->next = &pCVar2->list;
  (this->u).col.list.prev = pDVar27;
  (this->temp).stage = 0;
  this->initMaxabs = 0.0;
  if (0 < this->thedim) {
    lVar23 = 0;
    iVar17 = 0;
    do {
      pSVar9 = vec[lVar23];
      (this->u).col.start[lVar23] = iVar17;
      uVar20 = (ulong)pSVar9->memused;
      if ((long)uVar20 < 1) {
LAB_001dbbd9:
        this->stat = SINGULAR;
        return;
      }
      pNVar16 = pSVar9->m_elem;
      uVar19 = 0;
      uVar24 = 1;
      do {
        uVar19 = (eps < ABS(pNVar16->val)) + uVar19;
        if (uVar20 <= uVar24) break;
        pNVar16 = pNVar16 + 1;
        uVar24 = uVar24 + 1;
      } while (uVar19 < 2);
      iVar22 = (int)lVar23;
      if (uVar19 == 1) {
        pNVar16 = pSVar9->m_elem;
        do {
          pNVar14 = pNVar16;
          dVar32 = pNVar14->val;
          dVar31 = ABS(dVar32);
          pNVar16 = pNVar14 + 1;
        } while (dVar31 <= eps);
        iVar15 = pNVar14->idx;
        if (-1 < (this->row).perm[iVar15]) goto LAB_001dbbd9;
        if (this->initMaxabs <= dVar31 && dVar31 != this->initMaxabs) {
          this->initMaxabs = dVar31;
        }
        setPivot(this,(this->temp).stage,iVar22,iVar15,dVar32);
        piVar6[(this->temp).stage] = iVar22;
        piVar7 = &(this->temp).stage;
        *piVar7 = *piVar7 + 1;
        iVar15 = 0;
      }
      else {
        if (uVar19 == 0) goto LAB_001dbbd9;
        if (pSVar9->memused < 1) {
          iVar15 = 0;
        }
        else {
          piVar7 = (this->u).col.idx;
          piVar8 = (this->u).row.start;
          piVar10 = (this->u).row.len;
          pdVar11 = (this->u).row.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar12 = (this->u).row.idx;
          piVar21 = &pSVar9->m_elem->idx;
          lVar26 = 0;
          iVar15 = 0;
          do {
            dVar32 = ((Nonzero<double> *)(piVar21 + -2))->val;
            dVar31 = ABS(dVar32);
            if (eps < dVar31) {
              iVar5 = *piVar21;
              piVar7[iVar17] = iVar5;
              lVar29 = (long)piVar10[iVar5] + (long)piVar8[iVar5];
              piVar12[lVar29] = iVar22;
              pdVar11[lVar29] = dVar32;
              piVar4 = piVar10 + iVar5;
              *piVar4 = *piVar4 + 1;
              if (this->initMaxabs <= dVar31 && dVar31 != this->initMaxabs) {
                this->initMaxabs = dVar31;
              }
              iVar17 = iVar17 + 1;
              iVar15 = iVar15 + 1;
              uVar20 = (ulong)(uint)pSVar9->memused;
            }
            lVar26 = lVar26 + 1;
            piVar21 = piVar21 + 4;
          } while (lVar26 < (int)uVar20);
        }
      }
      (this->u).col.max[lVar23] = iVar15;
      (this->u).col.len[lVar23] = iVar15;
      (this->temp).s_cact[lVar23] = iVar15;
      lVar23 = lVar23 + 1;
    } while (lVar23 < this->thedim);
  }
  (this->u).col.used = iVar17;
  return;
}

Assistant:

void CLUFactor<R>::initFactorMatrix(const SVectorBase<R>** vec, const R eps)
{

   R x;
   int m;
   int tot;
   Dring* rring, *lastrring;
   Dring* cring, *lastcring;
   const SVectorBase<R>* psv;
   int* sing = temp.s_mark;

   /*  Initialize:
    *  - column file thereby remembering column singletons in |sing|.
    *  - nonzeros counts per row
    *  - total number of nonzeros
    */

   for(int i = 0; i < thedim; i++)
      u.row.max[i] = u.row.len[i] = 0;

   tot = 0;

   for(int i = 0; i < thedim; i++)
   {
      int k;

      psv = vec[i];
      k = psv->size();

      if(k > 1)
      {
         tot += k;

         for(int j = 0; j < k; ++j)
            u.row.max[psv->index(j)]++;
      }
      else if(k == 0)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }
   }

   /*  Resize nonzero memory if necessary
    */
   minRowMem(int(rowMemMult * tot));

   minColMem(int(colMemMult * tot));

   minLMem(int(lMemMult * tot));


   /*  Initialize:
    *  - row ring lists
    *  - row vectors in file
    *  - column ring lists
    */
   u.row.start[0] = 0;

   rring = u.row.elem;

   lastrring = &(u.row.list);

   lastrring->idx = thedim;

   lastrring->next = rring;

   cring = u.col.elem;

   lastcring = &(u.col.list);

   lastcring->idx = thedim;

   lastcring->next = cring;

   m = 0;

   for(int i = 0; i < thedim; i++)
   {
      u.row.start[i] = m;
      m += u.row.max[i];

      rring->idx = i;
      rring->prev = lastrring;
      lastrring->next = rring;
      lastrring = rring;
      ++rring;

      cring->idx = i;
      cring->prev = lastcring;
      lastcring->next = cring;
      lastcring = cring;
      ++cring;
   }

   u.row.start[thedim]       = 0;

   u.row.max[thedim]       = 0;
   u.row.used = m;

   lastrring->next = &(u.row.list);
   lastrring->next->prev = lastrring;

   lastcring->next = &(u.col.list);
   lastcring->next->prev = lastcring;

   /*  Copy matrix to row and column file
    *  excluding and marking column singletons!
    */
   m = 0;
   temp.stage = 0;

   initMaxabs = 0;

   for(int i = 0; i < thedim; i++)
   {
      int nnonzeros;

      psv = vec[i];
      u.col.start[i] = m;

      /* check whether number of nonzeros above tolerance is 0, 1 or >= 2 */
      nnonzeros = 0;

      for(int j = 0; j < psv->size() && nnonzeros <= 1; j++)
      {
         if(isNotZero(psv->value(j), eps))
            nnonzeros++;
      }

      /* basis is singular due to empty column */
      if(nnonzeros == 0)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }

      /* exclude column singletons */
      else if(nnonzeros == 1)
      {
         int j = 0;

         /* find nonzero */

         for(j = 0; isZero(psv->value(j), eps); j++)
            ;

         assert(j < psv->size());

         /* basis is singular due to two linearly dependent column singletons */
         if(row.perm[psv->index(j)] >= 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }

         /* update maximum absolute nonzero value */
         x = psv->value(j);

         if(spxAbs(x) > initMaxabs)
            initMaxabs = spxAbs(x);

         /* permute to front and mark as singleton */
         setPivot(temp.stage, i, psv->index(j), x);

         sing[temp.stage] = i;

         temp.stage++;

         /* set column length to zero */
         temp.s_cact[i] = u.col.len[i] = u.col.max[i] = 0;
      }

      /* add to active matrix if not a column singleton */
      else
      {
         int end;
         int k;

         /* go through all nonzeros in column */
         assert(nnonzeros >= 2);
         nnonzeros = 0;

         for(int j = 0; j < psv->size(); j++)
         {
            x = psv->value(j);

            if(isNotZero(x, eps))
            {
               /* add to column array */
               k = psv->index(j);
               u.col.idx[m] = k;
               m++;

               /* add to row array */
               end = u.row.start[k] + u.row.len[k];
               u.row.idx[end] = i;
               u.row.val[end] = x;
               u.row.len[k]++;

               /* update maximum absolute nonzero value */

               if(spxAbs(x) > initMaxabs)
                  initMaxabs = spxAbs(x);

               nnonzeros++;
            }
         }

         assert(nnonzeros >= 2);

         /* set column length */
         temp.s_cact[i] = u.col.len[i] = u.col.max[i] = nnonzeros;
      }
   }

   u.col.used = m;
}